

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O0

bool __thiscall QMetaType::load(QMetaType *this,QDataStream *stream,void *data)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  qulonglong ull;
  qlonglong ll;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  bool local_19;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX != (undefined8 *)0x0) {
    bVar2 = isValid((QMetaType *)in_RDI);
    if (bVar2) {
      iVar3 = id((QMetaType *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
      if (iVar3 == 0x20) {
        QDataStream::operator>>
                  (in_RDI,(qint64 *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
        *in_RDX = &DAT_aaaaaaaaaaaaaaaa;
        local_19 = true;
      }
      else {
        iVar3 = id((QMetaType *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac);
        if (iVar3 == 0x23) {
          QDataStream::operator>>
                    ((QDataStream *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                     (quint64 *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
          *in_RDX = &DAT_aaaaaaaaaaaaaaaa;
          local_19 = true;
        }
        else if (*(long *)((long)in_RDI->d + 0x60) == 0) {
          local_19 = false;
        }
        else {
          (**(code **)((long)in_RDI->d + 0x60))(in_RDI->d,in_RSI,in_RDX);
          local_19 = true;
        }
      }
      goto LAB_0038bf0d;
    }
  }
  local_19 = false;
LAB_0038bf0d:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_19;
  }
  __stack_chk_fail();
}

Assistant:

bool QMetaType::load(QDataStream &stream, void *data) const
{
    if (!data || !isValid())
        return false;

    // keep compatibility for long/ulong
    if (id() == QMetaType::Long) {
        qlonglong ll;
        stream >> ll;
        *(long *)data = long(ll);
        return true;
    } else if (id() == QMetaType::ULong) {
        qulonglong ull;
        stream >> ull;
        *(unsigned long *)data = (unsigned long)(ull);
        return true;
    }
    if (!d_ptr->dataStreamIn)
        return false;

    d_ptr->dataStreamIn(d_ptr, stream, data);
    return true;
}